

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O1

SampledSpectrum __thiscall pbrt::TabulatedBSSRDF::Sr(TabulatedBSSRDF *this,Float r)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  int ch;
  long lVar8;
  int i;
  long lVar9;
  int j;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 extraout_var [60];
  undefined1 auVar12 [64];
  SampledSpectrum SVar13;
  span<float> weights;
  span<float> weights_00;
  span<const_float> nodes;
  span<const_float> nodes_00;
  int radiusOffset;
  int rhoOffset;
  Float radiusWeights [4];
  Float rhoWeights [4];
  int local_80;
  int local_7c;
  float local_78 [4];
  float local_68 [4];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  _local_58 = ZEXT812(0);
  fStack_4c = 0.0;
  lVar8 = 0;
  do {
    fVar1 = r * (this->sigma_t).values.values[lVar8];
    weights.n = 4;
    weights.ptr = local_68;
    nodes.n = (this->table->rhoSamples).nStored;
    nodes.ptr = (this->table->rhoSamples).ptr;
    bVar7 = CatmullRomWeights(nodes,(this->rho).values.values[lVar8],&local_7c,weights);
    if (bVar7) {
      weights_00.n = 4;
      weights_00.ptr = local_78;
      nodes_00.n = (this->table->radiusSamples).nStored;
      nodes_00.ptr = (this->table->radiusSamples).ptr;
      bVar7 = CatmullRomWeights(nodes_00,fVar1,&local_80,weights_00);
      if (bVar7) {
        auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar9 = 0;
        do {
          lVar10 = 0;
          do {
            fVar2 = local_68[lVar9] * local_78[lVar10];
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              local_48 = auVar12._0_16_;
              auVar12._0_4_ =
                   BSSRDFTable::EvalProfile
                             (this->table,local_7c + (int)lVar9,local_80 + (int)lVar10);
              auVar12._4_60_ = extraout_var;
              auVar11 = vfmadd231ss_fma(local_48,auVar12._0_16_,ZEXT416((uint)fVar2));
              auVar12 = ZEXT1664(auVar11);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416(0),4);
        bVar7 = (bool)((byte)uVar4 & 1);
        *(uint *)(local_58 + lVar8 * 4) =
             (uint)bVar7 * (int)(auVar12._0_4_ / (fVar1 * 6.2831855)) +
             (uint)!bVar7 * (int)auVar12._0_4_;
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  fVar1 = (this->sigma_t).values.values[0];
  fVar2 = (this->sigma_t).values.values[1];
  fVar5 = (this->sigma_t).values.values[2];
  fVar6 = (this->sigma_t).values.values[3];
  auVar11._0_4_ = fVar1 * fVar1 * (float)local_58._0_4_;
  auVar11._4_4_ = fVar2 * fVar2 * (float)local_58._4_4_;
  auVar11._8_4_ = fVar5 * fVar5 * fStack_50;
  auVar11._12_4_ = fVar6 * fVar6 * fStack_4c;
  auVar11 = vmaxps_avx(auVar11,ZEXT816(0) << 0x40);
  auVar3 = vshufpd_avx(auVar11,auVar11,1);
  SVar13.values.values._0_8_ = auVar11._0_8_;
  SVar13.values.values._8_8_ = auVar3._0_8_;
  return (SampledSpectrum)SVar13.values.values;
}

Assistant:

PBRT_CPU_GPU
    SampledSpectrum Sr(Float r) const {
        SampledSpectrum Sr(0.f);
        for (int ch = 0; ch < NSpectrumSamples; ++ch) {
            // Convert $r$ into unitless optical radius $r_{\roman{optical}}$
            Float rOptical = r * sigma_t[ch];

            // Compute spline weights to interpolate BSSRDF on channel _ch_
            int rhoOffset, radiusOffset;
            Float rhoWeights[4], radiusWeights[4];
            if (!CatmullRomWeights(table->rhoSamples, rho[ch], &rhoOffset, rhoWeights) ||
                !CatmullRomWeights(table->radiusSamples, rOptical, &radiusOffset,
                                   radiusWeights))
                continue;

            // Set BSSRDF value _Sr[ch]_ using tensor spline interpolation
            Float sr = 0;
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j) {
                    // Accumulate contribution of $(i,j)$ table sample
                    if (Float weight = rhoWeights[i] * radiusWeights[j]; weight != 0)
                        sr +=
                            weight * table->EvalProfile(rhoOffset + i, radiusOffset + j);
                }
            // Cancel marginal PDF factor from tabulated BSSRDF profile
            if (rOptical != 0)
                sr /= 2 * Pi * rOptical;

            Sr[ch] = sr;
        }
        // Transform BSSRDF value into world space units
        Sr *= sigma_t * sigma_t;

        return ClampZero(Sr);
    }